

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode
JsAllocRawData(JsRuntimeHandle runtimeHandle,size_t sizeInBytes,bool zeroed,JsRef *buffer)

{
  anon_class_32_4_b9880ebd fn;
  size_t *in_stack_ffffffffffffffa8;
  JsRef *local_30;
  JsRef *buffer_local;
  size_t sStack_20;
  bool zeroed_local;
  size_t sizeInBytes_local;
  JsRuntimeHandle runtimeHandle_local;
  
  if (buffer == (JsRef *)0x0) {
    runtimeHandle_local._4_4_ = JsErrorNullArgument;
  }
  else {
    fn.buffer = (JsRef **)((long)&buffer_local + 7);
    fn.runtimeHandle = &local_30;
    fn.zeroed = (bool *)&stack0xffffffffffffffe0;
    fn.sizeInBytes = in_stack_ffffffffffffffa8;
    local_30 = buffer;
    buffer_local._7_1_ = zeroed;
    sStack_20 = sizeInBytes;
    sizeInBytes_local = (size_t)runtimeHandle;
    runtimeHandle_local._4_4_ = GlobalAPIWrapper_NoRecord<JsAllocRawData::__0>(fn);
  }
  return runtimeHandle_local._4_4_;
}

Assistant:

CHAKRA_API JsAllocRawData(_In_ JsRuntimeHandle runtimeHandle, _In_ size_t sizeInBytes, _In_ bool zeroed, _Out_ JsRef * buffer)
{
    PARAM_NOT_NULL(buffer);

    return GlobalAPIWrapper_NoRecord([&]() -> JsErrorCode {
        VALIDATE_INCOMING_RUNTIME_HANDLE(runtimeHandle);

        ThreadContext * threadContext = JsrtRuntime::FromHandle(runtimeHandle)->GetThreadContext();
        ThreadContextScope scope(threadContext);

        if (!scope.IsValid())
        {
            return JsErrorWrongThread;
        }

        Recycler * recycler = threadContext->GetRecycler();
        *buffer = zeroed
            ? RecyclerNewArrayZ(recycler, char, sizeInBytes)
            : RecyclerNewArray(recycler, char, sizeInBytes);
        return JsNoError;
    });
}